

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O1

cmCPackIFWRepository * __thiscall
cmCPackIFWGenerator::GetRepository(cmCPackIFWGenerator *this,string *repositoryName)

{
  RepositoriesMap *this_00;
  pointer *pppcVar1;
  cmCPackIFWGenerator *pcVar2;
  cmCPackLog *this_01;
  long *msg;
  bool bVar3;
  iterator iVar4;
  ostream *poVar5;
  size_t length;
  vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>> *this_02;
  iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
  pVar6;
  cmCPackIFWRepository *repository;
  ostringstream cmCPackLog_msg;
  cmCPackIFWRepository *local_1b8;
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  this_00 = &this->Repositories;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
          ::find(&this_00->_M_t,repositoryName);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->Repositories)._M_t._M_impl.super__Rb_tree_header)
  {
    local_1b8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
                ::operator[](this_00,repositoryName);
    std::__cxx11::string::_M_assign((string *)&local_1b8->Name);
    (local_1b8->super_cmCPackIFWCommon).Generator = this;
    bVar3 = cmCPackIFWRepository::ConfigureFromOptions(local_1b8);
    if (bVar3) {
      if (local_1b8->Update == None) {
        __position._M_current =
             (this->Installer).RemoteRepositories.
             super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (this->Installer).RemoteRepositories.
            super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          *__position._M_current = local_1b8;
          pppcVar1 = &(this->Installer).RemoteRepositories.
                      super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
          return local_1b8;
        }
        this_02 = (vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>> *)
                  &(this->Installer).RemoteRepositories;
      }
      else {
        __position._M_current =
             (this->Repository).RepositoryUpdate.
             super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (this->Repository).RepositoryUpdate.
            super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          *__position._M_current = local_1b8;
          pppcVar1 = &(this->Repository).RepositoryUpdate.
                      super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
          return local_1b8;
        }
        this_02 = (vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>> *)
                  &(this->Repository).RepositoryUpdate;
      }
      std::vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>>::
      _M_realloc_insert<cmCPackIFWRepository*const&>(this_02,__position,&local_1b8);
    }
    else {
      pVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
              ::equal_range(&this_00->_M_t,repositoryName);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
      local_1b8 = (cmCPackIFWRepository *)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Invalid repository \"",0x14);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,(repositoryName->_M_dataplus)._M_p,
                          repositoryName->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," configuration. Repository will be skipped.",0x2b);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      pcVar2 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar2 != (cmCPackIFWGenerator *)0x0) {
        this_01 = (pcVar2->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        msg = local_1b0;
        length = strlen((char *)local_1b0);
        cmCPackLog::Log(this_01,8,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                        ,0x261,(char *)msg,length);
        if (local_1b0 != local_1a0) {
          operator_delete(local_1b0,local_1a0[0] + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
      std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
    }
  }
  else {
    local_1b8 = (cmCPackIFWRepository *)(iVar4._M_node + 2);
  }
  return local_1b8;
}

Assistant:

cmCPackIFWRepository* cmCPackIFWGenerator::GetRepository(
  const std::string& repositoryName)
{
  RepositoriesMap::iterator rit = this->Repositories.find(repositoryName);
  if (rit != this->Repositories.end()) {
    return &(rit->second);
  }

  cmCPackIFWRepository* repository = &this->Repositories[repositoryName];
  repository->Name = repositoryName;
  repository->Generator = this;
  if (repository->ConfigureFromOptions()) {
    if (repository->Update == cmCPackIFWRepository::None) {
      this->Installer.RemoteRepositories.push_back(repository);
    } else {
      this->Repository.RepositoryUpdate.push_back(repository);
    }
  } else {
    this->Repositories.erase(repositoryName);
    repository = nullptr;
    cmCPackIFWLogger(WARNING,
                     "Invalid repository \""
                       << repositoryName << "\""
                       << " configuration. Repository will be skipped."
                       << std::endl);
  }
  return repository;
}